

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sumFinalize(sqlite3_context *context)

{
  Mem *p;
  double *pdVar1;
  anon_union_8_5_44880d43_for_u aVar2;
  
  p = context->pMem;
  if ((p->flags & 0x2000) == 0) {
    sqlite3VdbeMemReleaseExternal(p);
    p->flags = 1;
    p->z = (char *)0x0;
  }
  pdVar1 = (double *)p->z;
  if ((pdVar1 != (double *)0x0) && (0 < (long)pdVar1[2])) {
    if (*(char *)(pdVar1 + 3) != '\0') {
      context->isError = 1;
      sqlite3VdbeMemSetStr
                (&context->s,"integer overflow",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
      ;
      return;
    }
    if (*(char *)((long)pdVar1 + 0x19) != '\0') {
      sqlite3VdbeMemSetDouble(&context->s,*pdVar1);
      return;
    }
    aVar2 = *(anon_union_8_5_44880d43_for_u *)(pdVar1 + 1);
    sqlite3VdbeMemRelease(&context->s);
    (context->s).u = aVar2;
    (context->s).flags = 4;
    (context->s).type = '\x01';
  }
  return;
}

Assistant:

static void sumFinalize(sqlite3_context *context){
  SumCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  if( p && p->cnt>0 ){
    if( p->overflow ){
      sqlite3_result_error(context,"integer overflow",-1);
    }else if( p->approx ){
      sqlite3_result_double(context, p->rSum);
    }else{
      sqlite3_result_int64(context, p->iSum);
    }
  }
}